

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int JS_ExecutePendingJob(JSRuntime *rt,JSContext **pctx)

{
  JSValueUnion JVar1;
  list_head *plVar2;
  list_head *plVar3;
  long lVar4;
  int iVar5;
  list_head *plVar6;
  JSContext *pJVar7;
  JSValue v;
  JSValue v_00;
  
  if ((rt->job_list).next == &rt->job_list) {
    pJVar7 = (JSContext *)0x0;
    iVar5 = 0;
  }
  else {
    plVar2 = (rt->job_list).next;
    plVar6 = plVar2->prev;
    plVar3 = plVar2->next;
    plVar6->next = plVar3;
    plVar3->prev = plVar6;
    plVar2->prev = (list_head *)0x0;
    plVar2->next = (list_head *)0x0;
    pJVar7 = (JSContext *)plVar2[1].prev;
    v_00 = (JSValue)(*(code *)plVar2[1].next)(pJVar7,*(undefined4 *)&plVar2[2].prev,&plVar2[2].next)
    ;
    if (0 < *(int *)&plVar2[2].prev) {
      plVar6 = plVar2 + 3;
      lVar4 = 0;
      do {
        JVar1 = (JSValueUnion)plVar6[-1].next;
        plVar3 = plVar6->prev;
        if ((0xfffffff4 < (uint)plVar3) &&
           (iVar5 = *JVar1.ptr, *(int *)JVar1.ptr = iVar5 + -1, iVar5 < 2)) {
          v.tag = (int64_t)plVar3;
          v.u.ptr = JVar1.ptr;
          __JS_FreeValueRT(pJVar7->rt,v);
        }
        lVar4 = lVar4 + 1;
        plVar6 = plVar6 + 1;
      } while (lVar4 < *(int *)&plVar2[2].prev);
    }
    if ((0xfffffff4 < (uint)v_00.tag) &&
       (iVar5 = *v_00.u.ptr, *(int *)v_00.u.ptr = iVar5 + -1, iVar5 < 2)) {
      __JS_FreeValueRT(pJVar7->rt,v_00);
    }
    iVar5 = (uint)((uint)v_00.tag != 6) * 2 + -1;
    (*(pJVar7->rt->mf).js_free)(&pJVar7->rt->malloc_state,plVar2);
  }
  *pctx = pJVar7;
  return iVar5;
}

Assistant:

int JS_ExecutePendingJob(JSRuntime *rt, JSContext **pctx)
{
    JSContext *ctx;
    JSJobEntry *e;
    JSValue res;
    int i, ret;

    if (list_empty(&rt->job_list)) {
        *pctx = NULL;
        return 0;
    }

    /* get the first pending job and execute it */
    e = list_entry(rt->job_list.next, JSJobEntry, link);
    list_del(&e->link);
    ctx = e->ctx;
    res = e->job_func(e->ctx, e->argc, (JSValueConst *)e->argv);
    for(i = 0; i < e->argc; i++)
        JS_FreeValue(ctx, e->argv[i]);
    if (JS_IsException(res))
        ret = -1;
    else
        ret = 1;
    JS_FreeValue(ctx, res);
    js_free(ctx, e);
    *pctx = ctx;
    return ret;
}